

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_invalidate_phys_page_fast_ppc64
               (uc_struct_conflict11 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  uint uVar1;
  PageDesc *p_00;
  unsigned_long b;
  uint nr;
  PageDesc *p;
  uintptr_t retaddr_local;
  int len_local;
  tb_page_addr_t start_local;
  page_collection *pages_local;
  uc_struct_conflict11 *uc_local;
  
  p_00 = page_find(uc,start >> 0xc);
  if (p_00 != (PageDesc *)0x0) {
    if ((p_00->code_bitmap == (unsigned_long *)0x0) &&
       (uVar1 = p_00->code_write_count + 1, p_00->code_write_count = uVar1, 9 < uVar1)) {
      build_page_bitmap(uc,p_00);
    }
    if ((p_00->code_bitmap == (unsigned_long *)0x0) ||
       (uVar1 = (uint)start & 0xfff,
       (p_00->code_bitmap[uVar1 >> 6] >> ((byte)uVar1 & 0x3f) &
       (long)((1 << ((byte)len & 0x1f)) + -1)) != 0)) {
      tb_invalidate_phys_page_range__locked(uc,pages,p_00,start,start + (long)len,retaddr);
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}